

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O0

CURLcode Curl_output_ntlm(Curl_easy *data,_Bool proxy)

{
  int iVar1;
  connectdata *pcVar2;
  uchar *puVar3;
  size_t sVar4;
  char *pcVar5;
  char *local_a0;
  char *local_98;
  connectdata *conn;
  auth *authp;
  curlntlm *state;
  ntlmdata *ntlm;
  char *hostname;
  char *service;
  char *passwdp;
  char *userp;
  char **allocuserpwd;
  bufref ntlmmsg;
  size_t sStack_28;
  CURLcode result;
  size_t len;
  char *base64;
  Curl_easy *pCStack_10;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  len = 0;
  sStack_28 = 0;
  ntlmmsg.len._4_4_ = CURLE_OK;
  pcVar2 = data->conn;
  if (proxy) {
    userp = (char *)&(data->state).aptr.proxyuserpwd;
    passwdp = (data->state).aptr.proxyuser;
    service = (data->state).aptr.proxypasswd;
    if ((data->set).str[0x19] == (char *)0x0) {
      local_98 = "HTTP";
    }
    else {
      local_98 = (data->set).str[0x19];
    }
    hostname = local_98;
    ntlm = (ntlmdata *)(pcVar2->http_proxy).host.name;
    state = &(pcVar2->proxyntlm).flags;
    authp = (auth *)&pcVar2->proxy_ntlm_state;
    conn = (connectdata *)&(data->state).authproxy;
  }
  else {
    userp = (char *)&(data->state).aptr.userpwd;
    passwdp = (data->state).aptr.user;
    service = (data->state).aptr.passwd;
    if ((data->set).str[0xc] == (char *)0x0) {
      local_a0 = "HTTP";
    }
    else {
      local_a0 = (data->set).str[0xc];
    }
    hostname = local_a0;
    ntlm = (ntlmdata *)(pcVar2->host).name;
    state = &(pcVar2->ntlm).flags;
    authp = (auth *)&pcVar2->http_ntlm_state;
    conn = (connectdata *)&(data->state).authhost;
  }
  *(byte *)&(conn->cpool_node)._next = *(byte *)&(conn->cpool_node)._next & 0xfe;
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  if (service == (char *)0x0) {
    service = "";
  }
  base64._7_1_ = proxy;
  pCStack_10 = data;
  Curl_bufref_init((bufref *)&allocuserpwd);
  if ((int)authp->want == 3) {
    *(undefined4 *)&authp->want = 4;
  }
  iVar1 = (int)authp->want;
  if (iVar1 != 1) {
    if (iVar1 == 2) {
      ntlmmsg.len._4_4_ =
           Curl_auth_create_ntlm_type3_message
                     (pCStack_10,passwdp,service,(ntlmdata *)state,(bufref *)&allocuserpwd);
      if ((ntlmmsg.len._4_4_ == CURLE_OK) &&
         (sVar4 = Curl_bufref_len((bufref *)&allocuserpwd), sVar4 != 0)) {
        puVar3 = Curl_bufref_ptr((bufref *)&allocuserpwd);
        sVar4 = Curl_bufref_len((bufref *)&allocuserpwd);
        ntlmmsg.len._4_4_ =
             Curl_base64_encode((char *)puVar3,sVar4,(char **)&len,&stack0xffffffffffffffd8);
        if (ntlmmsg.len._4_4_ == CURLE_OK) {
          (*Curl_cfree)(*(void **)userp);
          pcVar5 = "";
          if ((base64._7_1_ & 1) != 0) {
            pcVar5 = "Proxy-";
          }
          pcVar5 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar5,len);
          *(char **)userp = pcVar5;
          (*Curl_cfree)((void *)len);
          if (*(long *)userp == 0) {
            ntlmmsg.len._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            *(undefined4 *)&authp->want = 3;
            *(byte *)&(conn->cpool_node)._next = *(byte *)&(conn->cpool_node)._next & 0xfe | 1;
          }
        }
      }
      goto LAB_001590fc;
    }
    if (iVar1 == 4) {
      (*Curl_cfree)(*(void **)userp);
      userp[0] = '\0';
      userp[1] = '\0';
      userp[2] = '\0';
      userp[3] = '\0';
      userp[4] = '\0';
      userp[5] = '\0';
      userp[6] = '\0';
      userp[7] = '\0';
      *(byte *)&(conn->cpool_node)._next = *(byte *)&(conn->cpool_node)._next & 0xfe | 1;
      goto LAB_001590fc;
    }
  }
  ntlmmsg.len._4_4_ =
       Curl_auth_create_ntlm_type1_message
                 (pCStack_10,passwdp,service,hostname,(char *)ntlm,(ntlmdata *)state,
                  (bufref *)&allocuserpwd);
  if (ntlmmsg.len._4_4_ == CURLE_OK) {
    puVar3 = Curl_bufref_ptr((bufref *)&allocuserpwd);
    sVar4 = Curl_bufref_len((bufref *)&allocuserpwd);
    ntlmmsg.len._4_4_ =
         Curl_base64_encode((char *)puVar3,sVar4,(char **)&len,&stack0xffffffffffffffd8);
    if (ntlmmsg.len._4_4_ == CURLE_OK) {
      (*Curl_cfree)(*(void **)userp);
      pcVar5 = "";
      if ((base64._7_1_ & 1) != 0) {
        pcVar5 = "Proxy-";
      }
      pcVar5 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar5,len);
      *(char **)userp = pcVar5;
      (*Curl_cfree)((void *)len);
      if (*(long *)userp == 0) {
        ntlmmsg.len._4_4_ = CURLE_OUT_OF_MEMORY;
      }
    }
  }
LAB_001590fc:
  Curl_bufref_free((bufref *)&allocuserpwd);
  return ntlmmsg.len._4_4_;
}

Assistant:

CURLcode Curl_output_ntlm(struct Curl_easy *data, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result = CURLE_OK;
  struct bufref ntlmmsg;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for an HTTP proxy */
  char **allocuserpwd;

  /* point to the username, password, service and host */
  const char *userp;
  const char *passwdp;
  const char *service = NULL;
  const char *hostname = NULL;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  struct auth *authp;
  struct connectdata *conn = data->conn;

  DEBUGASSERT(conn);
  DEBUGASSERT(data);

  if(proxy) {
#ifndef CURL_DISABLE_PROXY
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = data->state.aptr.proxyuser;
    passwdp = data->state.aptr.proxypasswd;
    service = data->set.str[STRING_PROXY_SERVICE_NAME] ?
      data->set.str[STRING_PROXY_SERVICE_NAME] : "HTTP";
    hostname = conn->http_proxy.host.name;
    ntlm = &conn->proxyntlm;
    state = &conn->proxy_ntlm_state;
    authp = &data->state.authproxy;
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  else {
    allocuserpwd = &data->state.aptr.userpwd;
    userp = data->state.aptr.user;
    passwdp = data->state.aptr.passwd;
    service = data->set.str[STRING_SERVICE_NAME] ?
      data->set.str[STRING_SERVICE_NAME] : "HTTP";
    hostname = conn->host.name;
    ntlm = &conn->ntlm;
    state = &conn->http_ntlm_state;
    authp = &data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(!Curl_hSecDll) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(!Curl_hSecDll)
      return err;
  }
#ifdef SECPKG_ATTR_ENDPOINT_BINDINGS
  ntlm->sslContext = conn->sslContext;
#endif
#endif

  Curl_bufref_init(&ntlmmsg);

  /* connection is already authenticated, do not send a header in future
   * requests so go directly to NTLMSTATE_LAST */
  if(*state == NTLMSTATE_TYPE3)
    *state = NTLMSTATE_LAST;

  switch(*state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(data, userp, passwdp,
                                                 service, hostname,
                                                 ntlm, &ntlmmsg);
    if(!result) {
      DEBUGASSERT(Curl_bufref_len(&ntlmmsg) != 0);
      result = Curl_base64_encode((const char *) Curl_bufref_ptr(&ntlmmsg),
                                  Curl_bufref_len(&ntlmmsg), &base64, &len);
      if(!result) {
        free(*allocuserpwd);
        *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                                proxy ? "Proxy-" : "",
                                base64);
        free(base64);
        if(!*allocuserpwd)
          result = CURLE_OUT_OF_MEMORY;
      }
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(data, userp, passwdp,
                                                 ntlm, &ntlmmsg);
    if(!result && Curl_bufref_len(&ntlmmsg)) {
      result = Curl_base64_encode((const char *) Curl_bufref_ptr(&ntlmmsg),
                                  Curl_bufref_len(&ntlmmsg), &base64, &len);
      if(!result) {
        free(*allocuserpwd);
        *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                                proxy ? "Proxy-" : "",
                                base64);
        free(base64);
        if(!*allocuserpwd)
          result = CURLE_OUT_OF_MEMORY;
        else {
          *state = NTLMSTATE_TYPE3; /* we send a type-3 */
          authp->done = TRUE;
        }
      }
    }
    break;

  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }
  Curl_bufref_free(&ntlmmsg);

  return result;
}